

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

matches * atomtab(disctx *ctx,ull *a,ull *m,void *v,int spos)

{
  match m_00;
  matches *pmVar1;
  ulong *in_RCX;
  long lVar2;
  ulong *in_RDX;
  ulong *in_RSI;
  undefined8 *puVar3;
  long in_RDI;
  undefined8 *puVar4;
  undefined4 in_R8D;
  bool bVar5;
  byte bVar6;
  matches *subm;
  match sm;
  int i_1;
  matches *res;
  int i;
  insn *tab;
  matches *in_stack_fffffffffffffe18;
  matches *in_stack_fffffffffffffe20;
  undefined8 local_108;
  ulong local_100;
  atom *atoms;
  disctx *in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff30 [132];
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar7;
  undefined4 in_stack_ffffffffffffffd0;
  ulong *puVar8;
  matches *local_8;
  
  bVar6 = 0;
  if (*(int *)(in_RDI + 0x48) == 0) {
    while( true ) {
      bVar5 = true;
      if ((((*in_RSI & in_RCX[1]) == *in_RCX) &&
          (((int)in_RCX[0x22] == 0 ||
           (bVar5 = true, ((uint)in_RCX[0x22] & *(uint *)(in_RDI + 0x38)) != 0)))) &&
         (bVar5 = false, *(int *)((long)in_RCX + 0x114) != 0)) {
        bVar5 = (*(uint *)((long)in_RCX + 0x114) & *(uint *)(in_RDI + 0x3c)) == 0;
      }
      if (!bVar5) break;
      in_RCX = in_RCX + 0x23;
    }
    *in_RDX = in_RCX[1] | *in_RDX;
    for (iVar7 = 0; iVar7 < 0x10; iVar7 = iVar7 + 1) {
      if (in_RCX[(long)iVar7 * 2 + 2] != 0) {
        (*(code *)in_RCX[(long)iVar7 * 2 + 2])(in_RDI,in_RSI,in_RDX,in_RCX[(long)iVar7 * 2 + 3],0);
      }
    }
    local_8 = (matches *)0x0;
  }
  else {
    puVar8 = in_RCX;
    local_8 = emptymatches();
    iVar7 = 0;
    while( true ) {
      if ((((int)in_RCX[(long)iVar7 * 0x23 + 0x22] == 0) ||
          (((uint)in_RCX[(long)iVar7 * 0x23 + 0x22] & *(uint *)(in_RDI + 0x38)) != 0)) &&
         ((*(int *)((long)in_RCX + (long)iVar7 * 0x118 + 0x114) == 0 ||
          ((*(uint *)((long)in_RCX + (long)iVar7 * 0x118 + 0x114) & *(uint *)(in_RDI + 0x3c)) != 0))
         )) {
        memset(&local_108,0,0xb8);
        local_100 = in_RCX[(long)iVar7 * 0x23];
        atoms = (atom *)in_RCX[(long)iVar7 * 0x23 + 1];
        puVar3 = &local_108;
        puVar4 = (undefined8 *)&stack0xfffffffffffffe18;
        for (lVar2 = 0x17; lVar2 != 0; lVar2 = lVar2 + -1) {
          *puVar4 = *puVar3;
          puVar3 = puVar3 + (ulong)bVar6 * -2 + 1;
          puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
        }
        m_00.relocs[5].bf._4_4_ = iVar7;
        m_00._0_132_ = in_stack_ffffffffffffff30;
        m_00.relocs[5].expr = (expr *)local_8;
        m_00.relocs[6].bf._0_4_ = in_stack_ffffffffffffffc0;
        m_00.relocs[6].bf._4_4_ = in_stack_ffffffffffffffc4;
        m_00.relocs[6].expr = (expr *)in_RCX;
        m_00.relocs[7].bf._0_4_ = in_stack_ffffffffffffffd0;
        m_00.relocs[7].bf._4_4_ = in_R8D;
        m_00.relocs[7].expr = (expr *)puVar8;
        m_00._176_8_ = in_RDX;
        pmVar1 = tabdesc(in_stack_ffffffffffffff18,m_00,atoms);
        if (pmVar1 != (matches *)0x0) {
          local_8 = catmatches(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
        }
      }
      if (((in_RCX[(long)iVar7 * 0x23 + 1] == 0) && ((int)in_RCX[(long)iVar7 * 0x23 + 0x22] == 0))
         && (*(int *)((long)in_RCX + (long)iVar7 * 0x118 + 0x114) == 0)) break;
      iVar7 = iVar7 + 1;
    }
  }
  return local_8;
}

Assistant:

struct matches *atomtab APROTO {
	const struct insn *tab = v;
	if (!ctx->reverse) {
		int i;
		while ((a[0]&tab->mask) != tab->val || (tab->vartype && !(tab->vartype & ctx->vartype)) || (tab->ptype && !(tab->ptype & ctx->ptype)))
			tab++;
		m[0] |= tab->mask;
		for (i = 0; i < 16; i++)
			if (tab->atoms[i].fun)
				tab->atoms[i].fun (ctx, a, m, tab->atoms[i].arg, 0);
		return NULL;
	} else {
		struct matches *res = emptymatches();
		int i;
		for (i = 0; ; i++) {
			if ((!tab[i].vartype || tab[i].vartype & ctx->vartype) && (!tab[i].ptype || tab[i].ptype & ctx->ptype)) {
				struct match sm = { 0, .a = {tab[i].val}, .m = {tab[i].mask}, .lpos = spos };
				struct matches *subm = tabdesc(ctx, sm, tab[i].atoms); 
				if (subm)
					res = catmatches(res, subm);
			}
			if (!tab[i].mask && !tab[i].vartype && !tab[i].ptype) break;
		}
		return res;
	}
}